

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::FormulasLoader::~FormulasLoader(FormulasLoader *this)

{
  (this->super_HelperLoaderBase)._vptr_HelperLoaderBase =
       (_func_int **)&PTR__FormulasLoader_0095e370;
  std::__cxx11::string::~string((string *)&this->mCurrentFormulaNewParamSid);
  COLLADAFW::UniqueId::~UniqueId(&this->mCurrentCSymbolFunctionUniqueId);
  std::__cxx11::string::~string((string *)&this->mCurrentTextDataAfterSep);
  std::__cxx11::string::~string((string *)&this->mCurrentTextData);
  std::_Deque_base<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>::~_Deque_base
            ((_Deque_base<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_> *)
             &this->mOperatorStack);
  std::
  deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
  ::~deque(&(this->mNodeListStack).c);
  return;
}

Assistant:

FormulasLoader::~FormulasLoader()
	{
	}